

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,TransportMode mode)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = (int)this != 0;
  pcVar1 = "Importance";
  if (!bVar2) {
    pcVar1 = "Radiance";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (ulong)bVar2 * 2 + 8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(TransportMode mode) {
    return mode == TransportMode::Radiance ? "Radiance" : "Importance";
}